

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseTextureInfo(TextureInfo *texinfo,string *err,json *o)

{
  undefined1 in_AL;
  bool bVar1;
  json *o_00;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (texinfo != (TextureInfo *)0x0) {
    std::__cxx11::string::string((string *)&local_40,"index",&local_61);
    std::__cxx11::string::string((string *)&local_60,"TextureInfo",&local_62);
    bVar1 = ParseIntegerProperty(&texinfo->index,err,o,&local_40,true,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    in_AL = std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_40,"texCoord",&local_61);
      std::__cxx11::string::string((string *)&local_60,"",&local_62);
      ParseIntegerProperty(&texinfo->texCoord,err,o,&local_40,false,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      ParseExtensionsProperty(&texinfo->extensions,(string *)o,o_00);
      in_AL = ParseExtrasProperty(&texinfo->extras,o);
    }
  }
  return (bool)in_AL;
}

Assistant:

static bool ParseTextureInfo(TextureInfo *texinfo, std::string *err,
                             const json &o) {
  if (texinfo == nullptr) {
    return false;
  }

  if (!ParseIntegerProperty(&texinfo->index, err, o, "index",
                            /* required */ true, "TextureInfo")) {
    return false;
  }

  ParseIntegerProperty(&texinfo->texCoord, err, o, "texCoord", false);

  ParseExtensionsProperty(&texinfo->extensions, err, o);
  ParseExtrasProperty(&texinfo->extras, o);

  return true;
}